

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O2

size_t mpp_buffer_get_size_with_caller(MppBuffer buffer,char *caller)

{
  size_t sVar1;
  
  if (buffer == (MppBuffer)0x0) {
    sVar1 = 0;
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_size invalid NULL input from %s\n",(char *)0x0,caller)
    ;
  }
  else {
    sVar1 = *(size_t *)((long)buffer + 0x88);
    if (sVar1 == 0) {
      _mpp_log_l(2,"mpp_buffer","mpp_buffer_get_size buffer %p ret zero size from %s\n",(char *)0x0,
                 buffer);
      sVar1 = *(size_t *)((long)buffer + 0x88);
    }
  }
  return sVar1;
}

Assistant:

size_t mpp_buffer_get_size_with_caller(MppBuffer buffer, const char *caller)
{
    if (NULL == buffer) {
        mpp_err("mpp_buffer_get_size invalid NULL input from %s\n", caller);
        return 0;
    }

    MppBufferImpl *p = (MppBufferImpl*)buffer;
    if (p->info.size == 0)
        mpp_err("mpp_buffer_get_size buffer %p ret zero size from %s\n", buffer, caller);

    return p->info.size;
}